

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::EmitSwiftDependencyInfo
          (cmNinjaTargetGenerator *this,cmSourceFile *source,string *config)

{
  pointer pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmMakefile *this_00;
  ValueHolder VVar3;
  __node_base _Var4;
  bool bVar5;
  cmGlobalNinjaGenerator *pcVar6;
  string *psVar7;
  cmValue cVar8;
  Value *pVVar9;
  mapped_type *pmVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string_view source_00;
  string_view source_01;
  size_type __dnew_2;
  Value entry;
  string objectFilePath;
  string objectFileName;
  size_type __dnew;
  string swiftDiaPath;
  string swiftDepsPath;
  string makeDepsPath;
  string dependFileName;
  string objectFileDir;
  string sourceFilePath;
  ValueHolder local_1e0;
  ValueHolder local_1d8;
  undefined1 local_1d0 [32];
  ValueHolder local_1b0;
  ValueHolder local_1a8;
  ValueHolder local_1a0;
  ValueHolder local_198;
  undefined8 local_190;
  ValueHolder local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  __node_base local_140;
  cmSourceFile *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  ValueHolder local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  GetCompiledSourceNinjaPath_abi_cxx11_((string *)&local_50,this,source);
  GetObjectFilePath((string *)&local_1b0,this,source,config);
  pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  psVar7 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,(string *)&local_1b0);
  local_180._M_allocated_capacity = (size_type)&local_170;
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar1,pcVar1 + psVar7->_M_string_length);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0.string_,(ulong)(local_1a0.int_ + 1));
  }
  local_1b0 = (ValueHolder)source;
  local_1a8.string_ = (char *)&local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_180._M_allocated_capacity,
             local_180._8_8_ + local_180._M_allocated_capacity);
  VVar3 = local_1b0;
  local_140._M_nxt = (_Hash_node_base *)0x17;
  local_1e0.string_ = local_1d0;
  local_1e0.int_ = std::__cxx11::string::_M_create(&local_1e0.uint_,(ulong)&local_140);
  local_1d0._0_8_ = local_140._M_nxt;
  builtin_strncpy((char *)local_1e0,"Swift_DE",8);
  *(undefined8 *)&((local_1e0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
       0x49434e45444e4550;
  *(undefined8 *)&((local_1e0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x7 =
       0x454c49465f534549;
  local_1d8.int_ = (LargestInt)local_140._M_nxt;
  local_1e0.string_[(long)local_140._M_nxt] = '\0';
  cVar8 = cmSourceFile::GetProperty((cmSourceFile *)VVar3.map_,(string *)&local_1e0);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0.string_,local_1d0._0_8_ + 1);
  }
  if (cVar8.Value == (string *)0x0) {
    local_1e0 = local_1a0;
    local_1d8.int_ = local_1a8.int_;
    local_1d0._0_8_ = (ValueHolder *)0xa;
    local_1d0._8_8_ = ".swiftdeps";
    views._M_len = 2;
    views._M_array = (iterator)&local_1e0;
    cmCatViews_abi_cxx11_(&local_f0,views);
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar1 = ((cVar8.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + (cVar8.Value)->_M_string_length);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8.string_,(long)local_198 + 1);
  }
  local_1b0 = (ValueHolder)source;
  local_1a8.string_ = (char *)&local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_180._M_allocated_capacity,
             local_180._8_8_ + local_180._M_allocated_capacity);
  VVar3 = local_1b0;
  local_140._M_nxt = (_Hash_node_base *)0x16;
  local_1e0.string_ = local_1d0;
  local_1e0.int_ = std::__cxx11::string::_M_create(&local_1e0.uint_,(ulong)&local_140);
  local_1d0._0_8_ = local_140._M_nxt;
  builtin_strncpy((char *)local_1e0,"Swift_DI",8);
  *(undefined8 *)&((local_1e0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
       0x434954534f4e4741;
  *(undefined8 *)&((local_1e0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x6 =
       0x454c49465f534349;
  local_1d8.int_ = (LargestInt)local_140._M_nxt;
  local_1e0.string_[(long)local_140._M_nxt] = '\0';
  cVar8 = cmSourceFile::GetProperty((cmSourceFile *)VVar3.map_,(string *)&local_1e0);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0.string_,local_1d0._0_8_ + 1);
  }
  if (cVar8.Value == (string *)0x0) {
    local_1e0 = local_1a0;
    local_1d8.int_ = local_1a8.int_;
    local_1d0._0_8_ = (ValueHolder *)0x4;
    local_1d0._8_8_ = ".dia";
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_1e0;
    cmCatViews_abi_cxx11_(&local_110,views_00);
  }
  else {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    pcVar1 = ((cVar8.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + (cVar8.Value)->_M_string_length);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8.string_,(long)local_198 + 1);
  }
  pcVar1 = (config->_M_dataplus)._M_p;
  local_140._M_nxt = (_Hash_node_base *)this;
  local_138 = source;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + config->_M_string_length);
  _Var4._M_nxt = local_140._M_nxt;
  pcVar2 = *(cmLocalNinjaGenerator **)(local_140._M_nxt + 0x16);
  GetObjectFilePath((string *)&local_1b0,(cmNinjaTargetGenerator *)local_140._M_nxt,local_138,
                    &local_130);
  pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator
                     (*(cmLocalNinjaGenerator **)(_Var4._M_nxt + 0x16));
  psVar7 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar6,(string *)&local_1b0);
  local_160._M_allocated_capacity = (size_type)&local_150;
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar1,pcVar1 + psVar7->_M_string_length);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0.string_,(ulong)(local_1a0.int_ + 1));
  }
  cmsys::SystemTools::GetFilenamePath((string *)&local_70,(string *)&local_160);
  this_00 = *(cmMakefile **)(_Var4._M_nxt + 2);
  local_1b0.string_ = (char *)&local_1a0;
  local_1e0.int_ = 0x23;
  local_1b0.int_ = std::__cxx11::string::_M_create(&local_1b0.uint_,(ulong)&local_1e0);
  local_1a0.int_ = local_1e0.int_;
  ((ValueHolder *)&(local_1b0.map_)->_M_t)[2] = (ValueHolder)0x534e5458455f454c;
  ((ValueHolder *)&(local_1b0.map_)->_M_t)[3] = (ValueHolder)0x4c5045525f4e4f49;
  builtin_strncpy((char *)local_1b0,"CMAKE_Sw",8);
  ((ValueHolder *)&(local_1b0.map_)->_M_t)[1] = (ValueHolder)0x465045445f746669;
  builtin_strncpy((char *)((long)&(local_1b0.map_)->_M_t + 0x1f),"LACE",4);
  local_1a8.int_ = local_1e0.int_;
  local_1b0.string_[(long)local_1e0.string_] = false;
  bVar5 = cmMakefile::IsOn(this_00,(string *)&local_1b0);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0.string_,(ulong)(local_1a0.int_ + 1));
  }
  if (bVar5) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_1e0,(string *)&local_160);
    local_1b0.int_ = local_1d8.int_;
    local_1a8.int_ = local_1e0.int_;
    local_1a0.int_ = 2;
    local_198 = (ValueHolder)0x694e37;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&local_1b0;
    cmCatViews_abi_cxx11_((string *)&local_90,views_01);
    if (local_1e0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) {
      operator_delete(local_1e0.string_,local_1d0._0_8_ + 1);
    }
    local_1e0.int_ = 1;
    local_1d8.string_ = local_1d0;
    local_1d0[0] = 0x2f;
    local_1b0 = (ValueHolder)local_70._8_8_;
    local_1a8.string_ = (char *)local_70._M_allocated_capacity;
    local_1a0.int_ = 1;
    local_190 = local_88;
    local_188.int_ = local_90.int_;
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_1b0;
    local_198.string_ = local_1d8.string_;
    cmCatViews_abi_cxx11_(&local_b0,views_02);
    source_00._M_str = local_b0._M_dataplus._M_p;
    source_00._M_len = local_b0._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_d0,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_00,SHELL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90 == &local_80) goto LAB_002883eb;
  }
  else {
    local_1b0 = (ValueHolder)local_160._8_8_;
    local_1a8.string_ = (char *)local_160._M_allocated_capacity;
    local_1a0.int_ = 2;
    local_198 = (ValueHolder)0x694e37;
    views_03._M_len = 2;
    views_03._M_array = (iterator)&local_1b0;
    cmCatViews_abi_cxx11_((string *)&local_1e0,views_03);
    source_01._M_str = local_1e0.string_;
    source_01._M_len = local_1d8.int_;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_d0,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_01,SHELL);
    local_80._M_allocated_capacity = local_1d0._0_8_;
    local_90 = local_1e0;
    if (local_1e0 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) goto LAB_002883eb;
  }
  operator_delete(local_90.string_,local_80._M_allocated_capacity + 1);
LAB_002883eb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_allocated_capacity != &local_150) {
    operator_delete((void *)local_160._M_allocated_capacity,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  Json::Value::Value((Value *)&local_1b0,objectValue);
  Json::Value::Value((Value *)&local_1e0,(String *)&local_180);
  pVVar9 = Json::Value::operator[]((Value *)&local_1b0,"object");
  Json::Value::operator=(pVVar9,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  Json::Value::Value((Value *)&local_1e0,&local_d0);
  pVVar9 = Json::Value::operator[]((Value *)&local_1b0,"dependencies");
  Json::Value::operator=(pVVar9,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  Json::Value::Value((Value *)&local_1e0,&local_f0);
  pVVar9 = Json::Value::operator[]((Value *)&local_1b0,"swift-dependencies");
  Json::Value::operator=(pVVar9,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  Json::Value::Value((Value *)&local_1e0,&local_110);
  pVVar9 = Json::Value::operator[]((Value *)&local_1b0,"diagnostics");
  Json::Value::operator=(pVVar9,(Value *)&local_1e0);
  Json::Value::~Value((Value *)&local_1e0);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](&this->Configs,config);
  pVVar9 = Json::Value::operator[](&pmVar10->SwiftOutputMap,(String *)&local_50);
  Json::Value::operator=(pVVar9,(Value *)&local_1b0);
  Json::Value::~Value((Value *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_allocated_capacity != &local_170) {
    operator_delete((void *)local_180._M_allocated_capacity,local_170._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::EmitSwiftDependencyInfo(
  cmSourceFile const* source, const std::string& config)
{
  std::string const sourceFilePath = this->GetCompiledSourceNinjaPath(source);
  std::string const objectFilePath =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
  std::string const swiftDepsPath = [source, objectFilePath]() -> std::string {
    if (cmValue name = source->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return *name;
    }
    return cmStrCat(objectFilePath, ".swiftdeps");
  }();
  std::string const swiftDiaPath = [source, objectFilePath]() -> std::string {
    if (cmValue name = source->GetProperty("Swift_DIAGNOSTICS_FILE")) {
      return *name;
    }
    return cmStrCat(objectFilePath, ".dia");
  }();
  std::string const makeDepsPath = [this, source, config]() -> std::string {
    cmLocalNinjaGenerator const* local = this->GetLocalGenerator();
    std::string const objectFileName =
      this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
    std::string const objectFileDir =
      cmSystemTools::GetFilenamePath(objectFileName);

    if (this->Makefile->IsOn("CMAKE_Swift_DEPFLE_EXTNSION_REPLACE")) {
      std::string dependFileName = cmStrCat(
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName), ".d");
      return local->ConvertToOutputFormat(
        cmStrCat(objectFileDir, '/', dependFileName),
        cmOutputConverter::SHELL);
    }
    return local->ConvertToOutputFormat(cmStrCat(objectFileName, ".d"),
                                        cmOutputConverter::SHELL);
  }();

  // build the source file mapping
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value entry = Json::Value(Json::objectValue);
  entry["object"] = objectFilePath;
  entry["dependencies"] = makeDepsPath;
  entry["swift-dependencies"] = swiftDepsPath;
  entry["diagnostics"] = swiftDiaPath;
  this->Configs[config].SwiftOutputMap[sourceFilePath] = entry;
}